

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O0

uint __thiscall
Parse::TPTP::addOverloadedFunction
          (TPTP *this,string *name,int arity,int symbolArity,bool *added,TermList *arg,
          Interpretation integer,Interpretation rational,Interpretation real)

{
  bool bVar1;
  undefined8 uVar2;
  UserErrorException *this_00;
  string *psVar3;
  int in_ECX;
  int in_EDX;
  TPTP *in_RSI;
  TermList in_RDI;
  TermList *in_R9;
  string msg;
  int i;
  TermList *n;
  TermList srt;
  string *in_stack_fffffffffffffc98;
  UserErrorException *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  Signature *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  TermList local_2e8;
  TermList local_2e0;
  TermList local_2d8;
  undefined1 local_2c9;
  string local_2c8 [32];
  uint64_t local_2a8;
  uint64_t local_2a0;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  uint64_t local_158;
  TermList local_150;
  int local_144;
  TermList *local_140;
  uint64_t local_138;
  TermList local_130;
  undefined1 local_121;
  TermList *local_30;
  int local_1c;
  uint local_4;
  
  if (in_EDX != in_ECX) {
    local_121 = 1;
    uVar2 = __cxa_allocate_exception(0x50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_RDI._content,&in_RSI->_containsConjecture);
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffcec);
    std::operator+(in_stack_fffffffffffffcd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffcec);
    std::operator+(in_stack_fffffffffffffcd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
    Lib::UserErrorException::Exception(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    local_121 = 0;
    __cxa_throw(uVar2,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  local_138 = in_R9->_content;
  local_30 = in_R9;
  local_1c = in_EDX;
  local_130 = sortOf(in_RSI,in_RDI);
  local_140 = Kernel::TermList::next(local_30);
  local_144 = 1;
  while( true ) {
    if (local_1c <= local_144) {
      local_2d8 = Kernel::AtomicSort::intSort();
      bVar1 = Kernel::TermList::operator==(&local_130,&local_2d8);
      if (bVar1) {
        local_4 = Kernel::Signature::addInterpretedFunction
                            (in_stack_fffffffffffffcb0,
                             (Interpretation)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                             (string *)in_stack_fffffffffffffca0);
      }
      else {
        local_2e0 = Kernel::AtomicSort::rationalSort();
        bVar1 = Kernel::TermList::operator==(&local_130,&local_2e0);
        if (bVar1) {
          local_4 = Kernel::Signature::addInterpretedFunction
                              (in_stack_fffffffffffffcb0,
                               (Interpretation)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                               (string *)in_stack_fffffffffffffca0);
        }
        else {
          local_2e8 = Kernel::AtomicSort::realSort();
          bVar1 = Kernel::TermList::operator==(&local_130,&local_2e8);
          if (!bVar1) {
            psVar3 = (string *)__cxa_allocate_exception(0x50);
            std::operator+((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                           in_stack_fffffffffffffce0);
            std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
            Lib::UserErrorException::Exception(in_stack_fffffffffffffca0,psVar3);
            __cxa_throw(psVar3,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
          local_4 = Kernel::Signature::addInterpretedFunction
                              (in_stack_fffffffffffffcb0,
                               (Interpretation)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                               (string *)in_stack_fffffffffffffca0);
        }
      }
      return local_4;
    }
    local_158 = local_140->_content;
    local_150 = sortOf(in_RSI,in_RDI);
    bVar1 = Kernel::TermList::operator!=(&local_150,&local_130);
    if (bVar1) break;
    local_140 = Kernel::TermList::next(local_140);
    local_144 = local_144 + 1;
  }
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                 in_stack_fffffffffffffce0);
  std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
  std::__cxx11::string::~string(local_198);
  Kernel::TermList::toString_abi_cxx11_
            ((TermList *)in_stack_fffffffffffffcd8,(bool)in_stack_fffffffffffffcd7);
  std::operator+((char *)in_stack_fffffffffffffca8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffca0);
  std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
  Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffcec);
  std::operator+(in_stack_fffffffffffffcd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
  std::operator+(in_stack_fffffffffffffca8,(char *)in_stack_fffffffffffffca0);
  local_2a8 = local_140->_content;
  local_2a0 = (uint64_t)sortOf(in_RSI,in_RDI);
  Kernel::TermList::toString_abi_cxx11_
            ((TermList *)in_stack_fffffffffffffcd8,(bool)in_stack_fffffffffffffcd7);
  std::operator+(in_stack_fffffffffffffcd8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
  std::__cxx11::string::operator+=(local_178,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_258);
  local_2c9 = 1;
  this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string(local_2c8,local_178);
  Lib::UserErrorException::Exception(this_00,in_stack_fffffffffffffc98);
  local_2c9 = 0;
  __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
              Lib::UserErrorException::~UserErrorException);
}

Assistant:

unsigned TPTP::addOverloadedFunction(std::string name,int arity,int symbolArity,bool& added,TermList& arg,
				     Theory::Interpretation integer,Theory::Interpretation rational,
				     Theory::Interpretation real)
{
  if (arity != symbolArity) {
    USER_ERROR(name + " is used with " + Int::toString(arity) + " argument(s) when there were "+Int::toString(symbolArity)+" expected");
  }
  TermList srt = sortOf(arg);
  TermList* n = arg.next();
  for(int i=1;i<arity;i++){
    if(sortOf(*n)!=srt){
      std::string msg = "The interpreted function symbol " + name + " is not used with a single sort.";
      msg += "\nArgument 0 is "+srt.toString()+" and argument "+Lib::Int::toString(i)+" is "+sortOf(*n).toString();
      USER_ERROR(msg);
    }
    n = n->next();
  }
  if (srt == AtomicSort::intSort()) {
    return env.signature->addInterpretedFunction(integer,name);
  }
  if (srt == AtomicSort::rationalSort()) {
    return env.signature->addInterpretedFunction(rational,name);
  }
  if (srt == AtomicSort::realSort()) {
    return env.signature->addInterpretedFunction(real,name);
  }
  USER_ERROR("The symbol " + name + " is used with a non-numeric type");
}